

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTuple.cpp
# Opt level: O1

Array<char,_void_(*)(char_*,_unsigned_long)> * __thiscall
Corrade::Containers::ArrayTuple::operator_cast_to_Array
          (Array<char,_void_(*)(char_*,_unsigned_long)> *__return_storage_ptr__,ArrayTuple *this)

{
  Deleter p_Var1;
  char *pcVar2;
  size_t sVar3;
  ostream *output;
  Error local_30;
  
  p_Var1 = this->_deleter;
  if (p_Var1 != anon_unknown_2::arrayTupleDeleter) {
    pcVar2 = this->_data;
    sVar3 = this->_size;
    this->_data = (char *)0x0;
    this->_size = 0;
    this->_deleter = (Deleter)0x0;
    __return_storage_ptr__->_data = pcVar2;
    __return_storage_ptr__->_size = sVar3;
    __return_storage_ptr__->_deleter = (_func_void_char_ptr_unsigned_long *)p_Var1;
    return __return_storage_ptr__;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&local_30,output,(Flags)0x0);
  Utility::Debug::operator<<
            (&local_30.super_Debug,
             "Containers::ArrayTuple: conversion to Array allowed only with trivially destructible types and a stateless destructor"
            );
  Utility::Error::~Error(&local_30);
  abort();
}

Assistant:

ArrayTuple::operator Array<char>() && {
    CORRADE_ASSERT(_deleter != arrayTupleDeleter,
        "Containers::ArrayTuple: conversion to Array allowed only with trivially destructible types and a stateless destructor", {});
    const Deleter deleter = _deleter;
    const std::size_t size = _size;
    return Array<char>{release(), size, deleter};
}